

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O1

void __thiscall
embree::SceneGraph::TransformNode::TransformNode
          (TransformNode *this,AffineSpace3fa *xfm0,AffineSpace3fa *xfm1,
          Ref<embree::SceneGraph::Node> *child)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  Vector *pVVar3;
  size_t sVar4;
  ulong uVar5;
  Node *pNVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  ulong uVar23;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar24;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar25;
  long lVar26;
  ulong uVar27;
  ulong uVar28;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  
  (this->super_Node).super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (this->super_Node).fileName._M_dataplus._M_p = (pointer)&(this->super_Node).fileName.field_2;
  (this->super_Node).fileName._M_string_length = 0;
  (this->super_Node).fileName.field_2._M_local_buf[0] = '\0';
  (this->super_Node).name._M_dataplus._M_p = (pointer)&(this->super_Node).name.field_2;
  (this->super_Node).name._M_string_length = 0;
  (this->super_Node).name.field_2._M_local_buf[0] = '\0';
  (this->super_Node).indegree = 0;
  (this->super_Node).closed = false;
  (this->super_Node).hasLightOrCamera = false;
  (this->super_Node).id = 0xffffffff;
  (this->super_Node).geometry = (void *)0x0;
  (this->super_Node).super_RefCount._vptr_RefCount = (_func_int **)&PTR__TransformNode_002cb540;
  uVar7 = *(undefined8 *)&(xfm0->l).vx.field_0;
  uVar8 = *(undefined8 *)((long)&(xfm0->l).vx.field_0 + 8);
  uVar9 = *(undefined8 *)&(xfm0->l).vy.field_0;
  uVar10 = *(undefined8 *)((long)&(xfm0->l).vy.field_0 + 8);
  uVar11 = *(undefined8 *)&(xfm0->l).vz.field_0;
  uVar12 = *(undefined8 *)((long)&(xfm0->l).vz.field_0 + 8);
  uVar13 = *(undefined8 *)&(xfm0->p).field_0;
  uVar14 = *(undefined8 *)((long)&(xfm0->p).field_0 + 8);
  uVar15 = *(undefined8 *)&(xfm1->l).vx.field_0;
  uVar16 = *(undefined8 *)((long)&(xfm1->l).vx.field_0 + 8);
  uVar17 = *(undefined8 *)&(xfm1->l).vy.field_0;
  uVar18 = *(undefined8 *)((long)&(xfm1->l).vy.field_0 + 8);
  uVar19 = *(undefined8 *)&(xfm1->l).vz.field_0;
  uVar20 = *(undefined8 *)((long)&(xfm1->l).vz.field_0 + 8);
  uVar21 = *(undefined8 *)&(xfm1->p).field_0;
  uVar22 = *(undefined8 *)((long)&(xfm1->p).field_0 + 8);
  (this->spaces).time_range.lower = 0.0;
  (this->spaces).time_range.upper = 1.0;
  (this->spaces).spaces.size_active = 0;
  (this->spaces).spaces.size_alloced = 0;
  *(undefined8 *)((long)&(this->spaces).spaces.size_alloced + 1) = 0;
  *(undefined8 *)((long)&(this->spaces).spaces.items + 1) = 0;
  pAVar24 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)alignedMalloc(0x40,0x10);
  (this->spaces).spaces.items = pAVar24;
  alignedFree((void *)0x0);
  (this->spaces).spaces.size_alloced = 1;
  pAVar24 = (this->spaces).spaces.items;
  (this->spaces).spaces.size_active = 1;
  *(undefined8 *)&(pAVar24->l).vx.field_0 = uVar7;
  *(undefined8 *)((long)&(pAVar24->l).vx.field_0 + 8) = uVar8;
  *(undefined8 *)&(pAVar24->l).vy.field_0 = uVar9;
  *(undefined8 *)((long)&(pAVar24->l).vy.field_0 + 8) = uVar10;
  *(undefined8 *)&(pAVar24->l).vz.field_0 = uVar11;
  *(undefined8 *)((long)&(pAVar24->l).vz.field_0 + 8) = uVar12;
  *(undefined8 *)&(pAVar24->p).field_0 = uVar13;
  *(undefined8 *)((long)&(pAVar24->p).field_0 + 8) = uVar14;
  sVar4 = (this->spaces).spaces.size_active;
  uVar5 = (this->spaces).spaces.size_alloced;
  uVar27 = sVar4 + 1;
  uVar28 = uVar5;
  if ((uVar5 < uVar27) && (uVar28 = uVar27, uVar23 = uVar5, uVar5 != 0)) {
    for (; uVar28 = uVar23, uVar23 < uVar27; uVar23 = uVar23 * 2 + (ulong)(uVar23 * 2 == 0)) {
    }
  }
  if (uVar5 != uVar28) {
    pAVar24 = (this->spaces).spaces.items;
    pAVar25 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)alignedMalloc(uVar28 << 6,0x10)
    ;
    (this->spaces).spaces.items = pAVar25;
    if ((this->spaces).spaces.size_active != 0) {
      lVar26 = 0x30;
      uVar27 = 0;
      do {
        pAVar25 = (this->spaces).spaces.items;
        puVar1 = (undefined8 *)((long)pAVar24 + lVar26 + -0x30);
        uVar7 = puVar1[1];
        puVar2 = (undefined8 *)((long)pAVar25 + lVar26 + -0x30);
        *puVar2 = *puVar1;
        puVar2[1] = uVar7;
        puVar1 = (undefined8 *)((long)pAVar24 + lVar26 + -0x20);
        uVar7 = puVar1[1];
        puVar2 = (undefined8 *)((long)pAVar25 + lVar26 + -0x20);
        *puVar2 = *puVar1;
        puVar2[1] = uVar7;
        puVar1 = (undefined8 *)((long)pAVar24 + lVar26 + -0x10);
        uVar7 = puVar1[1];
        puVar2 = (undefined8 *)((long)pAVar25 + lVar26 + -0x10);
        *puVar2 = *puVar1;
        puVar2[1] = uVar7;
        puVar1 = (undefined8 *)((long)&(pAVar24->l).vx.field_0 + lVar26);
        uVar7 = puVar1[1];
        puVar2 = (undefined8 *)((long)&(pAVar25->l).vx.field_0 + lVar26);
        *puVar2 = *puVar1;
        puVar2[1] = uVar7;
        uVar27 = uVar27 + 1;
        lVar26 = lVar26 + 0x40;
      } while (uVar27 < (this->spaces).spaces.size_active);
    }
    alignedFree(pAVar24);
    (this->spaces).spaces.size_active = sVar4;
    (this->spaces).spaces.size_alloced = uVar28;
  }
  sVar4 = (this->spaces).spaces.size_active;
  pAVar24 = (this->spaces).spaces.items;
  (this->spaces).spaces.size_active = sVar4 + 1;
  *(undefined8 *)&pAVar24[sVar4].l.vx.field_0 = uVar15;
  *(undefined8 *)((long)&pAVar24[sVar4].l.vx.field_0 + 8) = uVar16;
  pVVar3 = &pAVar24[sVar4].l.vy;
  *(undefined8 *)&pVVar3->field_0 = uVar17;
  *(undefined8 *)((long)&pVVar3->field_0 + 8) = uVar18;
  pVVar3 = &pAVar24[sVar4].l.vz;
  *(undefined8 *)&pVVar3->field_0 = uVar19;
  *(undefined8 *)((long)&pVVar3->field_0 + 8) = uVar20;
  local_a8 = (float)uVar21;
  fStack_a4 = (float)((ulong)uVar21 >> 0x20);
  fStack_a0 = (float)uVar22;
  fStack_9c = (float)((ulong)uVar22 >> 0x20);
  pVVar3 = &pAVar24[sVar4].p;
  (pVVar3->field_0).m128[0] = local_a8;
  (pVVar3->field_0).m128[1] = fStack_a4;
  (pVVar3->field_0).m128[2] = fStack_a0;
  (pVVar3->field_0).m128[3] = fStack_9c;
  pNVar6 = child->ptr;
  (this->child).ptr = pNVar6;
  if (pNVar6 != (Node *)0x0) {
    (*(pNVar6->super_RefCount)._vptr_RefCount[2])();
  }
  return;
}

Assistant:

TransformNode (const AffineSpace3fa& xfm0, const AffineSpace3fa& xfm1, const Ref<Node>& child)
        : spaces((AffineSpace3ff)xfm0,(AffineSpace3ff)xfm1), child(child) {}